

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O2

void __thiscall ConstantExpression::set(ConstantExpression *this,string *str)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  
  psVar1 = &this->m_text;
  (this->m_text)._M_string_length = 0;
  *(this->m_text)._M_dataplus._M_p = '\0';
  std::__cxx11::string::reserve((ulong)psVar1);
  cVar4 = (char)psVar1;
  std::__cxx11::string::push_back(cVar4);
  pcVar3 = (str->_M_dataplus)._M_p;
  pcVar5 = pcVar3;
  do {
    if (pcVar5 == pcVar3 + str->_M_string_length) {
      std::__cxx11::string::push_back(cVar4);
      this->m_isLiteral = true;
      return;
    }
    cVar2 = *pcVar5;
    switch(cVar2) {
    case '\a':
      break;
    case '\b':
    case '\f':
switchD_00110785_caseD_8:
      if ((byte)(cVar2 + 0x81U) < 0xa1) {
        std::__cxx11::string::append((char *)psVar1);
        std::__cxx11::string::push_back(cVar4);
      }
      std::__cxx11::string::push_back(cVar4);
      goto LAB_00110863;
    case '\t':
      break;
    case '\n':
      break;
    case '\v':
      break;
    case '\r':
      break;
    default:
      if (((cVar2 != '\\') && (cVar2 != '\'')) && (cVar2 != '\"')) goto switchD_00110785_caseD_8;
    }
    std::__cxx11::string::append((char *)psVar1);
LAB_00110863:
    pcVar5 = pcVar5 + 1;
    pcVar3 = (str->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

void set( const std::string& str )
	{
		m_text.clear();
		m_text.reserve(str.size() + 2);

		m_text += '\"';
		for( basic_string <char>::const_iterator i = str.begin(); i != str.end(); ++i)
		{
			switch(*i)
			{
				case '\"':	m_text += "\\\"";			break;
				case '\'':	m_text += "\\\'";			break;
				case '\r':	m_text += "\\r";			break;
				case '\n':	m_text += "\\n";			break;
				case '\t':	m_text += "\\t";			break;
				case '\v':	m_text += "\\v";			break;
				case '\a':	m_text += "\\a";			break;
				case '\\':	m_text += "\\\\";			break;
			
				default:
					{
						const char c = *i;

						if (c < 0x20 || c > 0x7e)
						{
							m_text += "\\x00";
							m_text += ToHex((c >> 4) & 0x0f);
							m_text += ToHex(c & 0x0f);
						}
						else
						{
							m_text += c;
						}
					}
					break;
			}
		}
		m_text += '\"';

		m_isLiteral = true;
	}